

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFlatImage.cpp
# Opt level: O1

void anon_unknown.dwarf_bd06::fillChannels(Rand48 *random,FlatImage *img)

{
  LevelMode LVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  LVar1 = Imf_2_5::Image::levelMode(&img->super_Image);
  if (LVar1 == ONE_LEVEL) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"        level 0",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
    iVar2 = (*(img->super_Image)._vptr_Image[3])(img,0);
    fillChannels(random,(FlatImageLevel *)CONCAT44(extraout_var_01,iVar2));
    return;
  }
  if (LVar1 == MIPMAP_LEVELS) {
    iVar2 = Imf_2_5::Image::numLevels(&img->super_Image);
    if (0 < iVar2) {
      uVar4 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"        level ",0xe);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"",0);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        iVar2 = (*(img->super_Image)._vptr_Image[3])(img,(ulong)uVar4);
        fillChannels(random,(FlatImageLevel *)CONCAT44(extraout_var_00,iVar2));
        uVar4 = uVar4 + 1;
        iVar2 = Imf_2_5::Image::numLevels(&img->super_Image);
      } while ((int)uVar4 < iVar2);
    }
  }
  else {
    if (LVar1 != RIPMAP_LEVELS) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfUtilTest/testFlatImage.cpp"
                    ,0x12d,"void (anonymous namespace)::fillChannels(Rand48 &, FlatImage &)");
    }
    iVar2 = Imf_2_5::Image::numYLevels(&img->super_Image);
    if (0 < iVar2) {
      uVar4 = 0;
      do {
        iVar2 = Imf_2_5::Image::numXLevels(&img->super_Image);
        if (0 < iVar2) {
          uVar6 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"        level (",0xf);
            poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
            poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,uVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
            std::ostream::put((char)poVar3);
            std::ostream::flush();
            iVar2 = (*(img->super_Image)._vptr_Image[5])(img,uVar6,(ulong)uVar4);
            fillChannels(random,(FlatImageLevel *)CONCAT44(extraout_var,iVar2));
            uVar5 = (int)uVar6 + 1;
            uVar6 = (ulong)uVar5;
            iVar2 = Imf_2_5::Image::numXLevels(&img->super_Image);
          } while ((int)uVar5 < iVar2);
        }
        uVar4 = uVar4 + 1;
        iVar2 = Imf_2_5::Image::numYLevels(&img->super_Image);
      } while ((int)uVar4 < iVar2);
    }
  }
  return;
}

Assistant:

void
fillChannels (Rand48 &random, FlatImage &img)
{
    switch (img.levelMode())
    {
      case ONE_LEVEL:

        cout << "        level 0" << endl;
        fillChannels (random, img.level());

        break;

      case MIPMAP_LEVELS:

        for (int x = 0; x < img.numLevels(); ++x)
        {
            cout << "        level " << x << "" << endl;
            fillChannels (random, img.level (x));
        }

        break;

      case RIPMAP_LEVELS:

        for (int y = 0; y < img.numYLevels(); ++y)
        {
            for (int x = 0; x < img.numXLevels(); ++x)
            {
                cout << "        level (" << x << ", " << y << ")" << endl;
                fillChannels (random, img.level (x, y));
            }
        }

        break;

      default:

        assert (false);
    }
}